

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O2

void __thiscall server::ctfservmode::flag::reset(flag *this)

{
  this->version = 0;
  this->spawnindex = -1;
  *(undefined8 *)&(this->spawnloc).field_0 = 0;
  (this->spawnloc).field_0.field_0.z = 0.0;
  *(undefined8 *)&(this->droploc).field_0 = 0;
  (this->droploc).field_0.field_0.z = 0.0;
  this->owner = -1;
  this->dropcount = 0;
  this->dropper = -1;
  this->invistime = 0;
  this->team = 0;
  this->droptime = 0;
  this->owntime = 0;
  this->holdtime = 0;
  return;
}

Assistant:

void reset()
        {
            version = 0;
            spawnindex = -1;
            droploc = spawnloc = vec(0, 0, 0);
#ifdef SERVMODE
            dropcount = 0;
            owner = dropper = -1;
            invistime = 0;
#else
            if(id >= 0) loopv(players) players[i]->flagpickup &= ~(1<<id);
            owner = NULL;
            dropangle = spawnangle = 0;
            interploc = vec(0, 0, 0);
            interpangle = 0;
            interptime = 0;
            vistime = -1000;
#endif
            team = 0;
            droptime = owntime = holdtime = 0;
        }